

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>
::set_value<std::__cxx11::string_const&>
          (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>
           *this,pointer dst,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args
          )

{
  pointer pcVar1;
  
  pcVar1 = (dst->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &dst->field_2) {
    operator_delete(pcVar1);
  }
  (dst->_M_dataplus)._M_p = (pointer)&dst->field_2;
  pcVar1 = (args->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)dst,pcVar1,pcVar1 + args->_M_string_length);
  return;
}

Assistant:

void set_value(pointer dst, Args&&... args) {
    dst->~value_type();  // delete the old value, if any
    new (dst) value_type(std::forward<Args>(args)...);
  }